

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

_Bool mev_sh_entry_conn_add(mev_sh_entry *e,connectdata *conn)

{
  bool bVar1;
  connectdata *conn_local;
  mev_sh_entry *e_local;
  
  bVar1 = e->conn == (connectdata *)0x0;
  if (bVar1) {
    e->conn = conn;
  }
  return bVar1;
}

Assistant:

static bool mev_sh_entry_conn_add(struct mev_sh_entry *e,
                                  struct connectdata *conn)
{
   /* detect weird values */
  DEBUGASSERT(mev_sh_entry_user_count(e) < 100000);
  DEBUGASSERT(!e->conn);
  if(e->conn)
    return FALSE;
  e->conn = conn;
  return TRUE;
}